

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<long,_unsigned_short,_12>::Addition(long *lhs,unsigned_short *rhs,long *result)

{
  long lVar1;
  long lVar2;
  uint64_t tmp;
  long *result_local;
  unsigned_short *rhs_local;
  long *lhs_local;
  
  lVar2 = *lhs + (ulong)*rhs;
  lVar1 = *lhs;
  if (lVar1 <= lVar2) {
    *result = lVar2;
  }
  return lVar1 <= lVar2;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        //lhs is std::int64_t, rhs unsigned < 64-bit
        std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

        if( (std::int64_t)tmp >= lhs )
        {
            result = (T)(std::int64_t)tmp;
            return true;
        }

        return false;
    }